

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkRules
          (cmNinjaNormalTargetGenerator *this,string *config)

{
  string *psVar1;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar2;
  cmGeneratorTarget *this_01;
  cmMakefile *this_02;
  TargetType targetType;
  string *psVar3;
  cmGlobalNinjaGenerator *pcVar4;
  string *psVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  allocator_type local_3d2;
  allocator<char> local_3d1;
  undefined1 local_3d0 [32];
  cmRulePlaceholderExpander *local_3b0;
  string compileCmd;
  string flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  undefined1 local_328 [32];
  string linker;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  cmNinjaRule rule;
  RuleVariables vars;
  string local_50;
  
  this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  LanguageLinkerCudaDeviceRule(&local_50,this,config);
  cmNinjaRule::cmNinjaRule(&rule,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flags,"CMAKE_CUDA_DEVICE_LINKER",(allocator<char> *)&local_368);
  psVar3 = cmMakefile::GetRequiredDefinition(this_00,&flags);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[35]>
            (&linker,psVar3,(char (*) [35])" -arch=$ARCH $REGISTER -o=$out $in");
  __l._M_len = 1;
  __l._M_array = &linker;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3d0,__l,(allocator_type *)&local_348);
  compileCmd._M_dataplus._M_p = (pointer)&compileCmd.field_2;
  compileCmd._M_string_length = 0;
  compileCmd.field_2._M_local_buf[0] = '\0';
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)&vars,pcVar2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_3d0,config,config,&compileCmd,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&rule.Command,(string *)&vars);
  std::__cxx11::string::~string((string *)&vars);
  std::__cxx11::string::~string((string *)&compileCmd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3d0);
  std::__cxx11::string::~string((string *)&linker);
  std::__cxx11::string::~string((string *)&flags);
  psVar3 = &rule.Comment;
  std::__cxx11::string::assign((char *)psVar3);
  psVar1 = &rule.Description;
  std::__cxx11::string::assign((char *)psVar1);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar4,&rule);
  memset(&vars,0,0x158);
  psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  vars.CMTargetName = (psVar5->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  psVar5 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  vars.CMTargetType = (psVar5->_M_dataplus)._M_p;
  vars.Language = "CUDA";
  vars.Object = "$out";
  vars.Fatbinary = "$FATBIN";
  vars.RegisterFile = "$REGISTER";
  vars.LinkFlags = "$LINK_FLAGS";
  this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flags,"CUDA",(allocator<char> *)&compileCmd);
  cmGeneratorTarget::GetLinkerTool(&linker,this_01,&flags,config);
  std::__cxx11::string::~string((string *)&flags);
  vars.Linker = linker._M_dataplus._M_p;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&compileCmd,"CUDA",(allocator<char> *)&local_368);
  local_3d0._0_8_ = local_3d0 + 0x10;
  local_3d0._8_8_ = (pointer)0x0;
  local_3d0[0x10] = '\0';
  cmCommonTargetGenerator::GetFlags
            (&flags,(cmCommonTargetGenerator *)this,&compileCmd,config,(string *)local_3d0);
  std::__cxx11::string::~string((string *)local_3d0);
  std::__cxx11::string::~string((string *)&compileCmd);
  vars.Flags = flags._M_dataplus._M_p;
  this_02 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3d0,"CMAKE_CUDA_DEVICE_LINK_COMPILE",(allocator<char> *)&local_368);
  psVar5 = cmMakefile::GetRequiredDefinition(this_02,(string *)local_3d0);
  std::__cxx11::string::string((string *)&compileCmd,(string *)psVar5);
  std::__cxx11::string::~string((string *)local_3d0);
  (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
    super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_3b0);
  cmRulePlaceholderExpander::ExpandRuleVariables
            (local_3b0,(cmOutputConverter *)(this->super_cmNinjaTargetGenerator).LocalGenerator,
             &compileCmd,&vars);
  LanguageLinkerCudaDeviceCompileRule((string *)local_3d0,this,config);
  std::__cxx11::string::operator=((string *)&rule,(string *)local_3d0);
  std::__cxx11::string::~string((string *)local_3d0);
  pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  std::__cxx11::string::string((string *)&local_368,(string *)&compileCmd);
  __l_00._M_len = 1;
  __l_00._M_array = &local_368;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_328,__l_00,(allocator_type *)&local_2e8);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)local_3d0,pcVar2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_328,config,config,&local_348,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&rule.Command,(string *)local_3d0);
  std::__cxx11::string::~string((string *)local_3d0);
  std::__cxx11::string::~string((string *)&local_348);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_328);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::assign((char *)psVar3);
  std::__cxx11::string::assign((char *)psVar1);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar4,&rule);
  LanguageLinkerCudaFatbinaryRule((string *)local_3d0,this,config);
  std::__cxx11::string::operator=((string *)&rule,(string *)local_3d0);
  std::__cxx11::string::~string((string *)local_3d0);
  pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"CMAKE_CUDA_FATBINARY",&local_3d1);
  psVar5 = cmMakefile::GetRequiredDefinition(this_00,&local_348);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[82]>
            (&local_368,psVar5,
             (char (*) [82])
             " -64 -cmdline=--compile-only -compress-all -link --embedded-fatbin=$out $PROFILES");
  __l_01._M_len = 1;
  __l_01._M_array = &local_368;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2e8,__l_01,&local_3d2);
  local_328._0_8_ = local_328 + 0x10;
  local_328._8_8_ = (pointer)0x0;
  local_328[0x10] = '\0';
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)local_3d0,pcVar2,&local_2e8,config,config,(string *)local_328,
             (cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&rule.Command,(string *)local_3d0);
  std::__cxx11::string::~string((string *)local_3d0);
  std::__cxx11::string::~string((string *)local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e8);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::assign((char *)psVar3);
  std::__cxx11::string::assign((char *)psVar1);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar4,&rule);
  if (local_3b0 != (cmRulePlaceholderExpander *)0x0) {
    (*(local_3b0->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
  }
  std::__cxx11::string::~string((string *)&compileCmd);
  std::__cxx11::string::~string((string *)&flags);
  std::__cxx11::string::~string((string *)&linker);
  cmNinjaRule::~cmNinjaRule(&rule);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkRules(
  const std::string& config)
{
  const cmMakefile* mf = this->GetMakefile();

  cmNinjaRule rule(this->LanguageLinkerCudaDeviceRule(config));
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
               " -arch=$ARCH $REGISTER -o=$out $in") },
    config, config);
  rule.Comment = "Rule for CUDA device linking.";
  rule.Description = "Linking CUDA $out";
  this->GetGlobalGenerator()->AddRule(rule);

  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = "$out";
  vars.Fatbinary = "$FATBIN";
  vars.RegisterFile = "$REGISTER";
  vars.LinkFlags = "$LINK_FLAGS";
  std::string linker =
    this->GetGeneratorTarget()->GetLinkerTool("CUDA", config);
  vars.Linker = linker.c_str();

  std::string flags = this->GetFlags("CUDA", config);
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetMakefile()->GetRequiredDefinition(
    "CMAKE_CUDA_DEVICE_LINK_COMPILE");
  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();
  rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                               compileCmd, vars);

  rule.Name = this->LanguageLinkerCudaDeviceCompileRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine({ compileCmd },
                                                             config, config);
  rule.Comment = "Rule for compiling CUDA device stubs.";
  rule.Description = "Compiling CUDA device stub $out";
  this->GetGlobalGenerator()->AddRule(rule);

  rule.Name = this->LanguageLinkerCudaFatbinaryRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
               " -64 -cmdline=--compile-only -compress-all -link "
               "--embedded-fatbin=$out $PROFILES") },
    config, config);
  rule.Comment = "Rule for CUDA fatbinaries.";
  rule.Description = "Creating fatbinary $out";
  this->GetGlobalGenerator()->AddRule(rule);
}